

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O2

unique_ptr<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_> __thiscall
MutableS2ShapeIndex::Iterator::Clone(Iterator *this)

{
  __uniq_ptr_impl<MutableS2ShapeIndex::Iterator,_std::default_delete<MutableS2ShapeIndex::Iterator>_>
  _Var1;
  tuple<MutableS2ShapeIndex::Iterator_*,_std::default_delete<MutableS2ShapeIndex::Iterator>_> in_RAX
  ;
  Iterator *in_RSI;
  __uniq_ptr_impl<MutableS2ShapeIndex::Iterator,_std::default_delete<MutableS2ShapeIndex::Iterator>_>
  local_18;
  
  local_18._M_t.
  super__Tuple_impl<0UL,_MutableS2ShapeIndex::Iterator_*,_std::default_delete<MutableS2ShapeIndex::Iterator>_>
  .super__Head_base<0UL,_MutableS2ShapeIndex::Iterator_*,_false>._M_head_impl =
       (tuple<MutableS2ShapeIndex::Iterator_*,_std::default_delete<MutableS2ShapeIndex::Iterator>_>)
       (tuple<MutableS2ShapeIndex::Iterator_*,_std::default_delete<MutableS2ShapeIndex::Iterator>_>)
       in_RAX.
       super__Tuple_impl<0UL,_MutableS2ShapeIndex::Iterator_*,_std::default_delete<MutableS2ShapeIndex::Iterator>_>
       .super__Head_base<0UL,_MutableS2ShapeIndex::Iterator_*,_false>._M_head_impl;
  absl::make_unique<MutableS2ShapeIndex::Iterator,MutableS2ShapeIndex::Iterator_const&>
            ((absl *)&local_18,in_RSI);
  _Var1._M_t.
  super__Tuple_impl<0UL,_MutableS2ShapeIndex::Iterator_*,_std::default_delete<MutableS2ShapeIndex::Iterator>_>
  .super__Head_base<0UL,_MutableS2ShapeIndex::Iterator_*,_false>._M_head_impl =
       local_18._M_t.
       super__Tuple_impl<0UL,_MutableS2ShapeIndex::Iterator_*,_std::default_delete<MutableS2ShapeIndex::Iterator>_>
       .super__Head_base<0UL,_MutableS2ShapeIndex::Iterator_*,_false>._M_head_impl;
  local_18._M_t.
  super__Tuple_impl<0UL,_MutableS2ShapeIndex::Iterator_*,_std::default_delete<MutableS2ShapeIndex::Iterator>_>
  .super__Head_base<0UL,_MutableS2ShapeIndex::Iterator_*,_false>._M_head_impl =
       (tuple<MutableS2ShapeIndex::Iterator_*,_std::default_delete<MutableS2ShapeIndex::Iterator>_>)
       (_Tuple_impl<0UL,_MutableS2ShapeIndex::Iterator_*,_std::default_delete<MutableS2ShapeIndex::Iterator>_>
        )0x0;
  (this->super_IteratorBase)._vptr_IteratorBase =
       (_func_int **)
       _Var1._M_t.
       super__Tuple_impl<0UL,_MutableS2ShapeIndex::Iterator_*,_std::default_delete<MutableS2ShapeIndex::Iterator>_>
       .super__Head_base<0UL,_MutableS2ShapeIndex::Iterator_*,_false>._M_head_impl;
  std::
  unique_ptr<MutableS2ShapeIndex::Iterator,_std::default_delete<MutableS2ShapeIndex::Iterator>_>::
  ~unique_ptr((unique_ptr<MutableS2ShapeIndex::Iterator,_std::default_delete<MutableS2ShapeIndex::Iterator>_>
               *)&local_18);
  return (__uniq_ptr_data<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>,_true,_true>
          )(__uniq_ptr_data<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>,_true,_true>
            )this;
}

Assistant:

unique_ptr<MutableS2ShapeIndex::IteratorBase>
MutableS2ShapeIndex::Iterator::Clone() const {
  return absl::make_unique<Iterator>(*this);
}